

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<int,std::__cxx11::string,int,unsigned_int>
               (ostream *out,char *fmt,int *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,int *args_2
               ,uint *args_3)

{
  long in_FS_OFFSET;
  FormatList local_78;
  FormatArg local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  code *local_48;
  code *local_40;
  int *local_38;
  code *local_30;
  code *local_28;
  uint *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_args = &local_68;
  local_78.m_N = 4;
  local_68.m_formatImpl = detail::FormatArg::formatImpl<int>;
  local_68.m_toIntImpl = detail::FormatArg::toIntImpl<int>;
  local_48 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_40 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_30 = detail::FormatArg::formatImpl<int>;
  local_28 = detail::FormatArg::toIntImpl<int>;
  local_18 = detail::FormatArg::formatImpl<unsigned_int>;
  local_10 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_68.m_value = args;
  local_50 = args_1;
  local_38 = args_2;
  local_20 = args_3;
  vformat(out,fmt,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}